

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O2

void __thiscall
Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data(Am_Load_Save_Context_Data *this)

{
  Am_Map_Loader *this_00;
  Am_Map_Saver *this_01;
  Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this_02;
  Am_Map_Names *this_03;
  Map<int,_Wrapper_Holder,_std::less<int>_> *this_04;
  Am_Map_References *this_05;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eae78;
  OpenAmulet::Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_>::Clear(this->loader);
  this_00 = this->loader;
  if (this_00 != (Am_Map_Loader *)0x0) {
    std::
    _Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
    ::~_Rb_tree((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
                 *)this_00);
  }
  operator_delete(this_00);
  OpenAmulet::Map<unsigned_short,_Am_Save_Method,_std::less<unsigned_short>_>::Clear(this->saver);
  this_01 = this->saver;
  if (this_01 != (Am_Map_Saver *)0x0) {
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Save_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Save_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Save_Method>_>_>
                 *)this_01);
  }
  operator_delete(this_01);
  OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::Clear(this->prototypes);
  this_02 = this->prototypes;
  if (this_02 != (Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)0x0) {
    OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::~Map(this_02);
  }
  operator_delete(this_02);
  OpenAmulet::Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_>::Clear(this->names);
  this_03 = this->names;
  if (this_03 != (Am_Map_Names *)0x0) {
    std::
    _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
    ::~_Rb_tree((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_Name_Num>,_std::_Select1st<std::pair<const_Wrapper_Holder,_Name_Num>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
                 *)this_03);
  }
  operator_delete(this_03);
  OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::Clear(this->wrappers);
  this_04 = this->wrappers;
  if (this_04 != (Map<int,_Wrapper_Holder,_std::less<int>_> *)0x0) {
    OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::~Map(this_04);
  }
  operator_delete(this_04);
  OpenAmulet::Map<Wrapper_Holder,_int,_std::less<Wrapper_Holder>_>::Clear(this->references);
  this_05 = this->references;
  if (this_05 != (Am_Map_References *)0x0) {
    std::
    _Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
    ::~_Rb_tree((_Rb_tree<Wrapper_Holder,_std::pair<const_Wrapper_Holder,_int>,_std::_Select1st<std::pair<const_Wrapper_Holder,_int>_>,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_int>_>_>
                 *)this_05);
  }
  operator_delete(this_05);
  return;
}

Assistant:

Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data()
{
  loader->Clear();
  delete (loader);

  saver->Clear();
  delete (saver);

  prototypes->Clear();
  delete (prototypes);

  names->Clear();
  delete (names);

  wrappers->Clear();
  delete (wrappers);

  references->Clear();
  delete (references);
}